

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O3

lzma_ret lzma_properties_decode
                   (lzma_filter *filter,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  code *UNRECOVERED_JUMPTABLE;
  lzma_ret lVar1;
  long lVar2;
  
  lVar2 = 0x18;
  do {
    if (*(lzma_vli *)((long)&TimeWords[0x88].name + lVar2) == filter->id) {
      filter->options = (void *)0x0;
      UNRECOVERED_JUMPTABLE = *(code **)((long)&decoders[0].id + lVar2);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        lVar1 = (*UNRECOVERED_JUMPTABLE)(&filter->options);
        return lVar1;
      }
      return (uint)(props_size != 0) << 3;
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x138);
  filter->options = (void *)0x0;
  return LZMA_OPTIONS_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_decode(lzma_filter *filter, lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	const lzma_filter_decoder *const fd = decoder_find(filter->id);

	// Make it always NULL so that the caller can always safely free() it.
	filter->options = NULL;

	if (fd == NULL)
		return LZMA_OPTIONS_ERROR;

	if (fd->props_decode == NULL)
		return props_size == 0 ? LZMA_OK : LZMA_OPTIONS_ERROR;

	return fd->props_decode(
			&filter->options, allocator, props, props_size);
}